

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O3

int __thiscall
QDomNamedNodeMapPrivate::clone
          (QDomNamedNodeMapPrivate *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  byte bVar1;
  Data *pDVar2;
  Span *pSVar3;
  long lVar4;
  ulong uVar5;
  QDomNamedNodeMapPrivate *this_00;
  QDomNodePrivate *arg;
  ulong uVar6;
  uchar *puVar7;
  
  this_00 = (QDomNamedNodeMapPrivate *)operator_new(0x28);
  (this_00->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 1;
  (this_00->map).d = (Data *)0x0;
  (this_00->map).m_size = 0;
  this_00->parent = (QDomNodePrivate *)__fn;
  this_00->readonly = this->readonly;
  this_00->appendToParent = this->appendToParent;
  pDVar2 = (this->map).d;
  if (pDVar2 == (Data *)0x0) {
LAB_001103f1:
    LOCK();
    (this_00->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (this_00->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    return (int)this_00;
  }
  pSVar3 = pDVar2->spans;
  if (pSVar3->offsets[0] == 0xff) {
    uVar5 = 1;
    do {
      uVar6 = uVar5;
      if (pDVar2->numBuckets == uVar6) goto LAB_001103f1;
      uVar5 = uVar6 + 1;
    } while (pSVar3[uVar6 >> 7].offsets[(uint)uVar6 & 0x7f] == 0xff);
  }
  else {
    uVar6 = 0;
  }
  puVar7 = pSVar3[uVar6 >> 7].entries[pSVar3[uVar6 >> 7].offsets[(uint)uVar6 & 0x7f]].storage.data +
           0x18;
  do {
    do {
      arg = (QDomNodePrivate *)
            (**(code **)(*(long *)**(undefined8 **)puVar7 + 0x40))
                      ((long *)**(undefined8 **)puVar7,1);
      arg->ownerNode = (QDomNodePrivate *)__fn;
      arg->field_0x98 = arg->field_0x98 | 2;
      setNamedItem(this_00,arg);
      lVar4 = *(long *)puVar7;
      puVar7 = (uchar *)(lVar4 + 8);
    } while (*(long *)(lVar4 + 8) != 0);
    do {
      if (pDVar2->numBuckets - 1 == uVar6) goto LAB_001103f1;
      uVar6 = uVar6 + 1;
      bVar1 = pDVar2->spans[uVar6 >> 7].offsets[(uint)uVar6 & 0x7f];
    } while (bVar1 == 0xff);
    puVar7 = pDVar2->spans[uVar6 >> 7].entries[bVar1].storage.data + 0x18;
  } while( true );
}

Assistant:

QDomNamedNodeMapPrivate* QDomNamedNodeMapPrivate::clone(QDomNodePrivate *pimpl)
{
    std::unique_ptr<QDomNamedNodeMapPrivate> m(new QDomNamedNodeMapPrivate(pimpl));
    m->readonly = readonly;
    m->appendToParent = appendToParent;

    auto it = map.constBegin();
    for (; it != map.constEnd(); ++it) {
        QDomNodePrivate *new_node = it.value()->cloneNode();
        new_node->setParent(pimpl);
        m->setNamedItem(new_node);
    }

    // we are no longer interested in ownership
    m->ref.deref();
    return m.release();
}